

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

void __thiscall SimpleLoggerMgr::addThread(SimpleLoggerMgr *this,uint64_t tid)

{
  mutex_type *in_RDI;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar1;
  unique_lock<std::mutex> l;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  value_type *in_stack_ffffffffffffffb8;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_ffffffffffffffc0;
  
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),in_RDI);
  pVar1 = std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::insert(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::unique_lock<std::mutex>::~unique_lock
            ((unique_lock<std::mutex> *)CONCAT17(pVar1.second,in_stack_ffffffffffffffb0));
  return;
}

Assistant:

void SimpleLoggerMgr::addThread(uint64_t tid) {
    std::unique_lock<std::mutex> l(activeThreadsLock);
    activeThreads.insert(tid);
}